

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O0

void __thiscall
disruptor::test::BusySpinStrategy::WaitForDependents::WaitForDependents(WaitForDependents *this)

{
  StrategyFixture<disruptor::BusySpinStrategy> *in_stack_00000020;
  
  StrategyFixture<disruptor::BusySpinStrategy>::StrategyFixture(in_stack_00000020);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForDependents) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor,
                                        allDependents(), alerted));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  // dependents haven't moved, WaitFor() should still block.
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_2.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_3.IncrementAndGet(1L);
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}